

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_short,_short>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_short,_short> *this)

{
  short sVar1;
  ushort uVar2;
  unsigned_short uVar3;
  unsigned_short *puVar4;
  short sVar5;
  bool bVar6;
  unsigned_long uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  
  bVar11 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      puVar4 = &this->min_max_diff;
      bVar6 = TrySubtractOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
                        (this->maximum,this->minimum,puVar4);
      this->can_do_for = bVar6;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        sVar1 = this->minimum_delta;
        if ((this->maximum_delta == sVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 8;
          return true;
        }
        uVar2 = this->min_max_delta_diff;
        if (uVar2 == 0) {
          bVar12 = 0;
        }
        else {
          sVar5 = 0xf;
          if (uVar2 != 0) {
            for (; uVar2 >> sVar5 == 0; sVar5 = sVar5 + -1) {
            }
          }
          bVar12 = 0x10;
          if (uVar2 < 0x4000) {
            bVar12 = 0x10 - ((byte)sVar5 ^ 0xf);
          }
        }
        uVar2 = *puVar4;
        if (uVar2 == 0) {
          bVar8 = 0;
        }
        else {
          sVar5 = 0xf;
          if (uVar2 != 0) {
            for (; uVar2 >> sVar5 == 0; sVar5 = sVar5 + -1) {
            }
          }
          bVar8 = 0x10;
          if (uVar2 < 0x4000) {
            bVar8 = 0x10 - ((byte)sVar5 ^ 0xf);
          }
        }
        bVar6 = this->mode != FOR;
        if (bVar6 && bVar12 < bVar8) {
          uVar13 = this->compression_buffer_idx;
          if (uVar13 != 0) {
            uVar9 = 0;
            do {
              this->delta_buffer[uVar9] = this->delta_buffer[uVar9] - sVar1;
              uVar9 = uVar9 + 1;
            } while (uVar13 != uVar9);
          }
          this->total_size = this->total_size + 0xc;
          if ((uVar13 & 0x1f) != 0) {
            uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
            uVar13 = (uVar13 - uVar7) + 0x20;
          }
          this->total_size = this->total_size + (bVar12 * uVar13 >> 3);
          if (bVar6 && bVar12 < bVar8) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        uVar2 = *puVar4;
        if (uVar2 == 0) {
          uVar13 = 0;
        }
        else {
          sVar1 = 0xf;
          if (uVar2 != 0) {
            for (; uVar2 >> sVar1 == 0; sVar1 = sVar1 + -1) {
            }
          }
          bVar12 = 0x10;
          if (uVar2 < 0x4000) {
            bVar12 = ((byte)sVar1 ^ 0xf0) + 0x11;
          }
          uVar13 = (ulong)bVar12;
        }
        uVar9 = this->compression_buffer_idx;
        if (uVar9 != 0) {
          puVar4 = this->compression_buffer;
          uVar3 = this->minimum;
          uVar10 = 0;
          do {
            puVar4[uVar10] = puVar4[uVar10] - uVar3;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        if ((uVar9 & 0x1f) != 0) {
          uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
          uVar9 = (uVar9 - uVar7) + 0x20;
        }
        this->total_size = this->total_size + (uVar9 * uVar13 >> 3) + 10;
      }
      else {
        bVar11 = false;
      }
    }
    else {
      this->total_size = this->total_size + 6;
    }
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}